

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O2

void ddCreateGroup(DdManager *table,int x,int y)

{
  DdSubtable *pDVar1;
  uint uVar2;
  uint uVar3;
  int gybot;
  
  pDVar1 = table->subtables;
  uVar2 = y;
  do {
    uVar3 = uVar2;
    uVar2 = pDVar1[(int)uVar3].next;
  } while (uVar3 < pDVar1[(int)uVar3].next);
  pDVar1[x].next = y;
  pDVar1[(int)uVar3].next = x;
  return;
}

Assistant:

static void
ddCreateGroup(
  DdManager * table,
  int  x,
  int  y)
{
    int  gybot;

#ifdef DD_DEBUG
    assert(y == x+1);
#endif

    /* Find bottom of second group. */
    gybot = y;
    while ((unsigned) gybot < table->subtables[gybot].next)
        gybot = table->subtables[gybot].next;

    /* Link groups. */
    table->subtables[x].next = y;
    table->subtables[gybot].next = x;

    return;

}